

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_elements_output_commitment_set
              (wally_tx_output *output,uchar *asset,size_t asset_len,uchar *value,size_t value_len,
              uchar *nonce,size_t nonce_len,uchar *surjectionproof,size_t surjectionproof_len,
              uchar *rangeproof,size_t rangeproof_len)

{
  uchar *p;
  size_t len;
  uchar *p_00;
  size_t len_00;
  uchar *p_01;
  size_t len_01;
  uchar *p_02;
  size_t len_02;
  uchar *p_03;
  size_t len_03;
  int iVar1;
  
  p = output->asset;
  len = output->asset_len;
  p_00 = output->value;
  len_00 = output->value_len;
  p_01 = output->nonce;
  len_01 = output->nonce_len;
  p_02 = output->surjectionproof;
  len_02 = output->surjectionproof_len;
  p_03 = output->rangeproof;
  len_03 = output->rangeproof_len;
  iVar1 = tx_elements_output_commitment_init
                    (output,asset,asset_len,value,value_len,nonce,nonce_len,surjectionproof,
                     surjectionproof_len,rangeproof,rangeproof_len,true);
  if (iVar1 == 0) {
    clear_and_free(p,len);
    clear_and_free(p_00,len_00);
    clear_and_free(p_01,len_01);
    clear_and_free(p_02,len_02);
    clear_and_free(p_03,len_03);
  }
  return iVar1;
}

Assistant:

int wally_tx_elements_output_commitment_set(
    struct wally_tx_output *output,
    const unsigned char *asset,
    size_t asset_len,
    const unsigned char *value,
    size_t value_len,
    const unsigned char *nonce,
    size_t nonce_len,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len)
{
#ifdef BUILD_ELEMENTS
    unsigned char *output_asset = output->asset;
    size_t output_asset_len = output->asset_len;
    unsigned char *output_value = output->value;
    size_t output_value_len = output->value_len;
    unsigned char *output_nonce = output->nonce;
    size_t output_nonce_len = output->nonce_len;
    unsigned char *output_surjectionproof = output->surjectionproof;
    size_t output_surjectionproof_len = output->surjectionproof_len;
    unsigned char *output_rangeproof = output->rangeproof;
    size_t output_rangeproof_len = output->rangeproof_len;
#endif /* BUILD_ELEMENTS */
    int ret = tx_elements_output_commitment_init(output, asset, asset_len,
                                                 value, value_len,
                                                 nonce, nonce_len,
                                                 surjectionproof, surjectionproof_len,
                                                 rangeproof, rangeproof_len, true);
    if (ret == WALLY_OK) {
#ifdef BUILD_ELEMENTS
        clear_and_free(output_asset, output_asset_len);
        clear_and_free(output_value, output_value_len);
        clear_and_free(output_nonce, output_nonce_len);
        clear_and_free(output_surjectionproof, output_surjectionproof_len);
        clear_and_free(output_rangeproof, output_rangeproof_len);
#endif /* BUILD_ELEMENTS */
    }
    return ret;
}